

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O3

void * get_new(t_symbol *why,int argc,t_atom *argv)

{
  t_object *owner;
  t_symbol *ptVar1;
  t_pd p_Var2;
  _binbuf *p_Var3;
  _outlet *p_Var4;
  t_atom *argv_00;
  uint argc_00;
  uint which;
  t_atom at;
  t_atom local_38;
  
  argv_00 = &local_38;
  owner = (t_object *)pd_new(get_class);
  ptVar1 = atom_getsymbolarg(0,argc,argv);
  p_Var2 = (t_pd)template_getbindsym(ptVar1);
  owner[1].te_g.g_pd = p_Var2;
  if (argc < 2) {
    local_38.a_type = A_SYMBOL;
    local_38.a_w.w_symbol = &s_;
    argc_00 = 1;
  }
  else {
    argc_00 = argc - 1;
    argv_00 = argv + 1;
  }
  p_Var3 = (_binbuf *)getbytes((ulong)argc_00 << 4);
  owner[1].te_binbuf = p_Var3;
  *(uint *)&owner[1].te_g.g_next = argc_00;
  which = 0;
  do {
    ptVar1 = atom_getsymbolarg(which,argc_00,argv_00);
    *(t_symbol **)p_Var3 = ptVar1;
    p_Var4 = outlet_new(owner,(t_symbol *)0x0);
    p_Var3->b_vec = (t_atom *)p_Var4;
    which = which + 1;
    p_Var3 = p_Var3 + 1;
  } while (argc_00 != which);
  return owner;
}

Assistant:

static void *get_new(t_symbol *why, int argc, t_atom *argv)
{
    t_get *x = (t_get *)pd_new(get_class);
    int varcount, i;
    t_atom at, *varvec;
    t_getvariable *sp;

    x->x_templatesym = template_getbindsym(atom_getsymbolarg(0, argc, argv));
    if (argc < 2)
    {
        varcount = 1;
        varvec = &at;
        SETSYMBOL(&at, &s_);
    }
    else varcount = argc - 1, varvec = argv + 1;
    x->x_variables
        = (t_getvariable *)getbytes(varcount * sizeof (*x->x_variables));
    x->x_nout = varcount;
    for (i = 0, sp = x->x_variables; i < varcount; i++, sp++)
    {
        sp->gv_sym = atom_getsymbolarg(i, varcount, varvec);
        sp->gv_outlet = outlet_new(&x->x_obj, 0);
            /* LATER connect with the template and set the outlet's type
            correctly.  We can't yet guarantee that the template is there
            before we hit this routine. */
    }
    return (x);
}